

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::SEES_PDU::SEES_PDU
          (SEES_PDU *this,EntityIdentifier *OriginatingEnt,KUINT16 IrSigIndex,
          KUINT16 AcousticSigIndex,KUINT16 RadarCrossSectionSigIndex)

{
  KUINT16 RadarCrossSectionSigIndex_local;
  KUINT16 AcousticSigIndex_local;
  KUINT16 IrSigIndex_local;
  EntityIdentifier *OriginatingEnt_local;
  SEES_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__SEES_PDU_00331c58;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_OriginatingEntity,OriginatingEnt);
  this->m_ui16IrSigRepIndex = IrSigIndex;
  this->m_ui16AcousticSigRepIndex = AcousticSigIndex;
  this->m_ui16CrossSection = RadarCrossSectionSigIndex;
  this->m_ui16NumPropulsionSys = 0;
  this->m_ui16NumVectoringNozzleSys = 0;
  std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ::vector(&this->m_vPropSys);
  std::
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ::vector(&this->m_vVecNozzleSys);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui8PDUType = '\x1e';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

SEES_PDU::SEES_PDU( const EntityIdentifier & OriginatingEnt, KUINT16 IrSigIndex, KUINT16 AcousticSigIndex,
                    KUINT16 RadarCrossSectionSigIndex ) :
    m_OriginatingEntity( OriginatingEnt ),
    m_ui16IrSigRepIndex( IrSigIndex ),
    m_ui16AcousticSigRepIndex( AcousticSigIndex ),
    m_ui16CrossSection( RadarCrossSectionSigIndex ),
    m_ui16NumPropulsionSys( 0 ),
    m_ui16NumVectoringNozzleSys( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = SupplementalEmission_EntityState_PDU_Type;
    m_ui16PDULength = SEES_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}